

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O0

PacketList * __thiscall
ASDCP::MXF::Partition::PacketList::GetMDObjectByType
          (PacketList *this,byte_t *ObjectID,InterchangeObject **Object)

{
  bool bVar1;
  uint uVar2;
  reference ppIVar3;
  _List_node_base *in_RCX;
  _Self local_40;
  _List_node_base *local_38;
  _List_iterator<ASDCP::MXF::InterchangeObject_*> local_30;
  iterator li;
  InterchangeObject **Object_local;
  byte_t *ObjectID_local;
  PacketList *this_local;
  
  if (Object == (InterchangeObject **)0x0) {
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_PTR);
  }
  else if (in_RCX == (_List_node_base *)0x0) {
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_PTR);
  }
  else {
    li._M_node = in_RCX;
    std::_List_iterator<ASDCP::MXF::InterchangeObject_*>::_List_iterator(&local_30);
    (li._M_node)->_M_next = (_List_node_base *)0x0;
    local_38 = (_List_node_base *)
               std::__cxx11::
               list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
               ::begin((list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
                        *)ObjectID);
    local_30._M_node = local_38;
    while( true ) {
      local_40._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>::
           end((list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
                *)ObjectID);
      bVar1 = std::operator!=(&local_30,&local_40);
      if (!bVar1) break;
      ppIVar3 = std::_List_iterator<ASDCP::MXF::InterchangeObject_*>::operator*(&local_30);
      uVar2 = (*((*ppIVar3)->super_KLVPacket)._vptr_KLVPacket[4])();
      if ((uVar2 & 1) != 0) {
        ppIVar3 = std::_List_iterator<ASDCP::MXF::InterchangeObject_*>::operator*(&local_30);
        (li._M_node)->_M_next = (_List_node_base *)*ppIVar3;
        Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
        return this;
      }
      std::_List_iterator<ASDCP::MXF::InterchangeObject_*>::operator++(&local_30,0);
    }
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_FAIL);
  }
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::MXF::Partition::PacketList::GetMDObjectByType(const byte_t* ObjectID, InterchangeObject** Object)
{
  ASDCP_TEST_NULL(ObjectID);
  ASDCP_TEST_NULL(Object);
  std::list<InterchangeObject*>::iterator li;
  *Object = 0;

  for ( li = m_List.begin(); li != m_List.end(); li++ )
    {
      if ( (*li)->HasUL(ObjectID) )
	{
	  *Object = *li;
	  return RESULT_OK;
	}
    }

  return RESULT_FAIL;
}